

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,2>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,SOS_1or2_Constraint<2> *sos,
               ItemNamer *vnam)

{
  double value;
  double value_00;
  BasicWriter<char> *pBVar1;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  BasicStringRef<char> value_04;
  BasicStringRef<char> value_05;
  
  value_01.size_ = 0xe;
  value_01.data_ = "SOS2Constraint";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_01);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
            (wrt,&sos->v_,vnam);
  value_02.size_ = 2;
  value_02.data_ = ", ";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_02);
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
            (wrt,&sos->w_);
  value = (sos->extra_info_).bounds_.lb_;
  value_00 = (sos->extra_info_).bounds_.ub_;
  value_03.size_ = 3;
  value_03.data_ = "; [";
  pBVar1 = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_03);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,value);
  value_04.size_ = 2;
  value_04.data_ = ", ";
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,value_04);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,value_00);
  value_05.size_ = 1;
  value_05.data_ = "]";
  fmt::BasicWriter<char>::operator<<(pBVar1,value_05);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,')');
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt, const SOS_1or2_Constraint<type>& sos,
                    ItemNamer& vnam) {
  // Type 1/2 should be in the name.
  wrt << sos.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, sos.get_vars(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, sos.get_weights());
  auto bnds = sos.get_sum_of_vars_range();
  wrt << "; [" << bnds.lb_ << ", " << bnds.ub_ << "]";
  wrt << ')';
}